

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistanceFinder.cpp
# Opt level: O0

void __thiscall OpenMD::DistanceFinder::DistanceFinder(DistanceFinder *this,SimInfo *info)

{
  int iVar1;
  reference ppMVar2;
  reference ppSVar3;
  reference ppBVar4;
  reference ppBVar5;
  reference ppTVar6;
  reference ppIVar7;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  Inversion *inversion;
  Torsion *torsion;
  Bend *bend;
  Bond *bond;
  RigidBody *rb;
  Atom *atom;
  Molecule *mol;
  InversionIterator inversionIter;
  TorsionIterator torsionIter;
  BendIterator bendIter;
  BondIterator bondIter;
  RigidBodyIterator rbIter;
  AtomIterator ai;
  MoleculeIterator mi;
  value_type_conflict2 *in_stack_fffffffffffffd68;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd88;
  int in_stack_fffffffffffffd8c;
  SimInfo *in_stack_fffffffffffffd90;
  SimInfo *local_a8;
  Torsion *local_a0;
  Bend *local_98;
  Bond *local_90;
  RigidBody *local_88;
  Atom *local_80;
  Molecule *local_78;
  __normal_iterator<OpenMD::Inversion_**,_std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>_>
  local_70;
  __normal_iterator<OpenMD::Torsion_**,_std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>_>
  local_68;
  __normal_iterator<OpenMD::Bend_**,_std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>_>
  local_60;
  __normal_iterator<OpenMD::Bond_**,_std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>_>
  local_58;
  __normal_iterator<OpenMD::RigidBody_**,_std::vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>_>
  local_50;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_48;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_40;
  int local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  uint local_28;
  int local_14;
  
  *in_RDI = in_RSI;
  std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::vector
            ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)0x41b8d3);
  std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>::vector
            ((vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_> *)0x41b8ec);
  std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>::vector
            ((vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_> *)0x41b905);
  std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>::vector
            ((vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_> *)0x41b91e);
  std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>::vector
            ((vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_> *)0x41b937);
  std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>::vector
            ((vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_> *)0x41b950);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x41b977);
  iVar1 = SimInfo::getNGlobalAtoms((SimInfo *)*in_RDI);
  local_14 = SimInfo::getNGlobalRigidBodies((SimInfo *)*in_RDI);
  local_14 = iVar1 + local_14;
  std::vector<int,_std::allocator<int>_>::push_back
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  local_28 = SimInfo::getNGlobalBonds((SimInfo *)*in_RDI);
  std::vector<int,_std::allocator<int>_>::push_back
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  local_2c = SimInfo::getNGlobalBends((SimInfo *)*in_RDI);
  std::vector<int,_std::allocator<int>_>::push_back
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  local_30 = SimInfo::getNGlobalTorsions((SimInfo *)*in_RDI);
  std::vector<int,_std::allocator<int>_>::push_back
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  local_34 = SimInfo::getNGlobalInversions((SimInfo *)*in_RDI);
  std::vector<int,_std::allocator<int>_>::push_back
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  local_38 = SimInfo::getNGlobalMolecules((SimInfo *)*in_RDI);
  std::vector<int,_std::allocator<int>_>::push_back
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  std::vector<int,_std::allocator<int>_>::operator[]
            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x13),0);
  std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::resize
            ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)
             in_stack_fffffffffffffd90,CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88)
            );
  std::vector<int,_std::allocator<int>_>::operator[]
            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x13),1);
  std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>::resize
            ((vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_> *)in_stack_fffffffffffffd90,
             CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
  std::vector<int,_std::allocator<int>_>::operator[]
            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x13),2);
  std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>::resize
            ((vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_> *)in_stack_fffffffffffffd90,
             CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
  std::vector<int,_std::allocator<int>_>::operator[]
            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x13),3);
  std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>::resize
            ((vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_> *)
             in_stack_fffffffffffffd90,CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88)
            );
  std::vector<int,_std::allocator<int>_>::operator[]
            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x13),4);
  std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>::resize
            ((vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_> *)
             in_stack_fffffffffffffd90,CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88)
            );
  std::vector<int,_std::allocator<int>_>::operator[]
            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x13),5);
  std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>::resize
            ((vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_> *)
             in_stack_fffffffffffffd90,CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88)
            );
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(&local_40);
  __gnu_cxx::
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  ::__normal_iterator(&local_48);
  __gnu_cxx::
  __normal_iterator<OpenMD::RigidBody_**,_std::vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>_>
  ::__normal_iterator(&local_50);
  __gnu_cxx::
  __normal_iterator<OpenMD::Bond_**,_std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>_>
  ::__normal_iterator(&local_58);
  __gnu_cxx::
  __normal_iterator<OpenMD::Bend_**,_std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>_>
  ::__normal_iterator(&local_60);
  __gnu_cxx::
  __normal_iterator<OpenMD::Torsion_**,_std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>_>
  ::__normal_iterator(&local_68);
  __gnu_cxx::
  __normal_iterator<OpenMD::Inversion_**,_std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>_>
  ::__normal_iterator(&local_70);
  local_78 = SimInfo::beginMolecule
                       (in_stack_fffffffffffffd90,
                        (MoleculeIterator *)
                        CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
  while (local_78 != (Molecule *)0x0) {
    iVar1 = Molecule::getGlobalIndex(local_78);
    ppMVar2 = std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>::operator[]
                        ((vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_> *)
                         (in_RDI + 0x10),(long)iVar1);
    *ppMVar2 = local_78;
    local_80 = Molecule::beginAtom((Molecule *)in_stack_fffffffffffffd90,
                                   (iterator *)
                                   CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
    while (local_80 != (Atom *)0x0) {
      iVar1 = StuntDouble::getGlobalIndex(&local_80->super_StuntDouble);
      ppSVar3 = std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::
                operator[]((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)
                           (in_RDI + 1),(long)iVar1);
      *ppSVar3 = &local_80->super_StuntDouble;
      local_80 = Molecule::nextAtom((Molecule *)in_stack_fffffffffffffd90,
                                    (iterator *)
                                    CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
    }
    local_88 = Molecule::beginRigidBody
                         ((Molecule *)in_stack_fffffffffffffd90,
                          (iterator *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88))
    ;
    while (local_88 != (RigidBody *)0x0) {
      iVar1 = StuntDouble::getGlobalIndex(&local_88->super_StuntDouble);
      ppSVar3 = std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::
                operator[]((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)
                           (in_RDI + 1),(long)iVar1);
      *ppSVar3 = &local_88->super_StuntDouble;
      local_88 = Molecule::nextRigidBody
                           ((Molecule *)in_stack_fffffffffffffd90,
                            (iterator *)
                            CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
    }
    local_90 = Molecule::beginBond((Molecule *)in_stack_fffffffffffffd90,
                                   (iterator *)
                                   CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
    while (local_90 != (Bond *)0x0) {
      iVar1 = ShortRangeInteraction::getGlobalIndex(&local_90->super_ShortRangeInteraction);
      ppBVar4 = std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>::operator[]
                          ((vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_> *)(in_RDI + 4),
                           (long)iVar1);
      *ppBVar4 = local_90;
      local_90 = Molecule::nextBond((Molecule *)in_stack_fffffffffffffd90,
                                    (iterator *)
                                    CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
    }
    local_98 = Molecule::beginBend((Molecule *)in_stack_fffffffffffffd90,
                                   (iterator *)
                                   CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
    while (local_98 != (Bend *)0x0) {
      iVar1 = ShortRangeInteraction::getGlobalIndex(&local_98->super_ShortRangeInteraction);
      ppBVar5 = std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>::operator[]
                          ((vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_> *)(in_RDI + 7),
                           (long)iVar1);
      *ppBVar5 = local_98;
      local_98 = Molecule::nextBend((Molecule *)in_stack_fffffffffffffd90,
                                    (iterator *)
                                    CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
    }
    local_a0 = Molecule::beginTorsion
                         ((Molecule *)in_stack_fffffffffffffd90,
                          (iterator *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88))
    ;
    while (local_a0 != (Torsion *)0x0) {
      iVar1 = ShortRangeInteraction::getGlobalIndex(&local_a0->super_ShortRangeInteraction);
      ppTVar6 = std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>::operator[]
                          ((vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_> *)
                           (in_RDI + 10),(long)iVar1);
      *ppTVar6 = local_a0;
      local_a0 = Molecule::nextTorsion
                           ((Molecule *)in_stack_fffffffffffffd90,
                            (iterator *)
                            CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
    }
    in_stack_fffffffffffffd90 =
         (SimInfo *)
         Molecule::beginInversion
                   ((Molecule *)in_stack_fffffffffffffd90,
                    (iterator *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
    local_a8 = in_stack_fffffffffffffd90;
    while (local_a8 != (SimInfo *)0x0) {
      in_stack_fffffffffffffd8c =
           ShortRangeInteraction::getGlobalIndex((ShortRangeInteraction *)local_a8);
      ppIVar7 = std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>::operator[]
                          ((vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_> *)
                           (in_RDI + 0xd),(long)in_stack_fffffffffffffd8c);
      *ppIVar7 = (value_type)local_a8;
      local_a8 = (SimInfo *)
                 Molecule::nextInversion
                           ((Molecule *)in_stack_fffffffffffffd90,
                            (iterator *)
                            CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
    }
    local_78 = SimInfo::nextMolecule
                         (in_stack_fffffffffffffd90,
                          (MoleculeIterator *)
                          CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
  }
  return;
}

Assistant:

DistanceFinder::DistanceFinder(SimInfo* info) : info_(info) {
    nObjects_.push_back(info_->getNGlobalAtoms() +
                        info_->getNGlobalRigidBodies());
    nObjects_.push_back(info_->getNGlobalBonds());
    nObjects_.push_back(info_->getNGlobalBends());
    nObjects_.push_back(info_->getNGlobalTorsions());
    nObjects_.push_back(info_->getNGlobalInversions());
    nObjects_.push_back(info_->getNGlobalMolecules());

    stuntdoubles_.resize(nObjects_[STUNTDOUBLE]);
    bonds_.resize(nObjects_[BOND]);
    bends_.resize(nObjects_[BEND]);
    torsions_.resize(nObjects_[TORSION]);
    inversions_.resize(nObjects_[INVERSION]);
    molecules_.resize(nObjects_[MOLECULE]);

    SimInfo::MoleculeIterator mi;
    Molecule::AtomIterator ai;
    Molecule::RigidBodyIterator rbIter;
    Molecule::BondIterator bondIter;
    Molecule::BendIterator bendIter;
    Molecule::TorsionIterator torsionIter;
    Molecule::InversionIterator inversionIter;

    Molecule* mol;
    Atom* atom;
    RigidBody* rb;
    Bond* bond;
    Bend* bend;
    Torsion* torsion;
    Inversion* inversion;

    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      molecules_[mol->getGlobalIndex()] = mol;

      for (atom = mol->beginAtom(ai); atom != NULL; atom = mol->nextAtom(ai)) {
        stuntdoubles_[atom->getGlobalIndex()] = atom;
      }
      for (rb = mol->beginRigidBody(rbIter); rb != NULL;
           rb = mol->nextRigidBody(rbIter)) {
        stuntdoubles_[rb->getGlobalIndex()] = rb;
      }
      for (bond = mol->beginBond(bondIter); bond != NULL;
           bond = mol->nextBond(bondIter)) {
        bonds_[bond->getGlobalIndex()] = bond;
      }
      for (bend = mol->beginBend(bendIter); bend != NULL;
           bend = mol->nextBend(bendIter)) {
        bends_[bend->getGlobalIndex()] = bend;
      }
      for (torsion = mol->beginTorsion(torsionIter); torsion != NULL;
           torsion = mol->nextTorsion(torsionIter)) {
        torsions_[torsion->getGlobalIndex()] = torsion;
      }
      for (inversion = mol->beginInversion(inversionIter); inversion != NULL;
           inversion = mol->nextInversion(inversionIter)) {
        inversions_[inversion->getGlobalIndex()] = inversion;
      }
    }
  }